

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth_kbd_packet.c
# Opt level: O0

int userauth_keyboard_interactive_decode_info_request(LIBSSH2_SESSION *session)

{
  int iVar1;
  void *pvVar2;
  undefined1 local_50 [8];
  string_buf decoded;
  uchar local_2d;
  uint32_t tmp_u32;
  uchar packet_type;
  uint i;
  size_t language_tag_len;
  uchar *language_tag;
  LIBSSH2_SESSION *session_local;
  
  local_50 = (undefined1  [8])session->userauth_kybd_data;
  decoded.data = session->userauth_kybd_data;
  decoded.dataptr = (uchar *)session->userauth_kybd_data_len;
  language_tag = (uchar *)session;
  if (session->userauth_kybd_data_len < 0x11) {
    _libssh2_error(session,-0x26,"userauth keyboard data buffer too small to get length");
    session_local._4_4_ = -1;
  }
  else {
    _libssh2_get_byte((string_buf *)local_50,&local_2d);
    iVar1 = _libssh2_copy_string
                      ((LIBSSH2_SESSION *)language_tag,(string_buf *)local_50,
                       (uchar **)(language_tag + 0x11a98),(size_t *)(language_tag + 0x11a90));
    if (iVar1 == -1) {
      _libssh2_error((LIBSSH2_SESSION *)language_tag,-6,
                     "Unable to decode keyboard-interactive \'name\' request field");
      session_local._4_4_ = -1;
    }
    else {
      iVar1 = _libssh2_copy_string
                        ((LIBSSH2_SESSION *)language_tag,(string_buf *)local_50,
                         (uchar **)(language_tag + 0x11aa8),(size_t *)(language_tag + 0x11aa0));
      if (iVar1 == -1) {
        _libssh2_error((LIBSSH2_SESSION *)language_tag,-6,
                       "Unable to decode keyboard-interactive \'instruction\' request field");
        session_local._4_4_ = -1;
      }
      else {
        iVar1 = _libssh2_get_string((string_buf *)local_50,(uchar **)&language_tag_len,
                                    (size_t *)&stack0xffffffffffffffd8);
        if (iVar1 == -1) {
          _libssh2_error((LIBSSH2_SESSION *)language_tag,-6,
                         "Unable to decode keyboard-interactive \'language tag\' request field");
          session_local._4_4_ = -1;
        }
        else {
          iVar1 = _libssh2_get_u32((string_buf *)local_50,(uint32_t *)((long)&decoded.len + 4));
          if (iVar1 == -1) {
            _libssh2_error((LIBSSH2_SESSION *)language_tag,-0x26,
                           "Unable to decode keyboard-interactive number of keyboard prompts");
            session_local._4_4_ = -1;
          }
          else {
            *(undefined4 *)(language_tag + 0x11ab0) = decoded.len._4_4_;
            if (*(uint *)(language_tag + 0x11ab0) < 0x65) {
              if (*(int *)(language_tag + 0x11ab0) == 0) {
                session_local._4_4_ = 0;
              }
              else {
                pvVar2 = _libssh2_calloc((LIBSSH2_SESSION *)language_tag,
                                         (ulong)*(uint *)(language_tag + 0x11ab0) * 0x18);
                *(void **)(language_tag + 0x11ab8) = pvVar2;
                if (*(long *)(language_tag + 0x11ab8) == 0) {
                  _libssh2_error((LIBSSH2_SESSION *)language_tag,-6,
                                 "Unable to allocate memory for keyboard-interactive prompts array")
                  ;
                  session_local._4_4_ = -1;
                }
                else {
                  pvVar2 = _libssh2_calloc((LIBSSH2_SESSION *)language_tag,
                                           (ulong)*(uint *)(language_tag + 0x11ab0) << 4);
                  *(void **)(language_tag + 0x11ac0) = pvVar2;
                  if (*(long *)(language_tag + 0x11ac0) == 0) {
                    _libssh2_error((LIBSSH2_SESSION *)language_tag,-6,
                                   "Unable to allocate memory for keyboard-interactive responses array"
                                  );
                    session_local._4_4_ = -1;
                  }
                  else {
                    for (tmp_u32 = 0; tmp_u32 < *(uint *)(language_tag + 0x11ab0);
                        tmp_u32 = tmp_u32 + 1) {
                      iVar1 = _libssh2_copy_string
                                        ((LIBSSH2_SESSION *)language_tag,(string_buf *)local_50,
                                         (uchar **)
                                         (*(long *)(language_tag + 0x11ab8) + (ulong)tmp_u32 * 0x18)
                                         ,(size_t *)
                                          (*(long *)(language_tag + 0x11ab8) + (ulong)tmp_u32 * 0x18
                                          + 8));
                      if (iVar1 == -1) {
                        _libssh2_error((LIBSSH2_SESSION *)language_tag,-6,
                                       "Unable to decode keyboard-interactive prompt message");
                        return -1;
                      }
                      iVar1 = _libssh2_get_boolean
                                        ((string_buf *)local_50,
                                         (uchar *)(*(long *)(language_tag + 0x11ab8) +
                                                   (ulong)tmp_u32 * 0x18 + 0x10));
                      if (iVar1 == -1) {
                        _libssh2_error((LIBSSH2_SESSION *)language_tag,-0x26,
                                       "Unable to decode user auth keyboard prompt echo");
                        return -1;
                      }
                    }
                    session_local._4_4_ = 0;
                  }
                }
              }
            }
            else {
              _libssh2_error((LIBSSH2_SESSION *)language_tag,-0x29,
                             "Too many replies for keyboard-interactive prompts");
              session_local._4_4_ = -1;
            }
          }
        }
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

int userauth_keyboard_interactive_decode_info_request(LIBSSH2_SESSION *session)
{
    unsigned char *language_tag;
    size_t language_tag_len;
    unsigned int i;
    unsigned char packet_type;
    uint32_t tmp_u32;

    struct string_buf decoded;

    decoded.data = session->userauth_kybd_data;
    decoded.dataptr = session->userauth_kybd_data;
    decoded.len = session->userauth_kybd_data_len;

    if(session->userauth_kybd_data_len < 17) {
        _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                       "userauth keyboard data buffer too small "
                       "to get length");
        return -1;
    }

    /* byte      SSH_MSG_USERAUTH_INFO_REQUEST */
    _libssh2_get_byte(&decoded, &packet_type);

    /* string    name (ISO-10646 UTF-8) */
    if(_libssh2_copy_string(session, &decoded,
                            &session->userauth_kybd_auth_name,
                            &session->userauth_kybd_auth_name_len) == -1) {
        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                       "Unable to decode "
                       "keyboard-interactive 'name' "
                       "request field");
        return -1;
    }

    /* string    instruction (ISO-10646 UTF-8) */
    if(_libssh2_copy_string(session, &decoded,
                            &session->userauth_kybd_auth_instruction,
                            &session->userauth_kybd_auth_instruction_len)
       == -1) {
        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                       "Unable to decode "
                       "keyboard-interactive 'instruction' "
                       "request field");
        return -1;
    }

    /* string    language tag (as defined in [RFC-3066]) */
    if(_libssh2_get_string(&decoded, &language_tag,
                           &language_tag_len) == -1) {
        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                       "Unable to decode "
                       "keyboard-interactive 'language tag' "
                       "request field");
        return -1;
    }

    /* int       num-prompts */
    if(_libssh2_get_u32(&decoded, &tmp_u32) == -1 ||
       (session->userauth_kybd_num_prompts = tmp_u32) != tmp_u32) {
        _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                       "Unable to decode "
                       "keyboard-interactive number of keyboard prompts");
        return -1;
    }

    if(session->userauth_kybd_num_prompts > 100) {
        _libssh2_error(session, LIBSSH2_ERROR_OUT_OF_BOUNDARY,
                       "Too many replies for "
                       "keyboard-interactive prompts");
        return -1;
    }

    if(session->userauth_kybd_num_prompts == 0) {
        return 0;
    }

    session->userauth_kybd_prompts =
        LIBSSH2_CALLOC(session,
                       sizeof(LIBSSH2_USERAUTH_KBDINT_PROMPT) *
                       session->userauth_kybd_num_prompts);
    if(!session->userauth_kybd_prompts) {
        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                       "Unable to allocate memory for "
                       "keyboard-interactive prompts array");
        return -1;
    }

    session->userauth_kybd_responses =
        LIBSSH2_CALLOC(session,
                       sizeof(LIBSSH2_USERAUTH_KBDINT_RESPONSE) *
                       session->userauth_kybd_num_prompts);
    if(!session->userauth_kybd_responses) {
        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                       "Unable to allocate memory for "
                       "keyboard-interactive responses array");
        return -1;
    }

    for(i = 0; i < session->userauth_kybd_num_prompts; i++) {
        /* string    prompt[1] (ISO-10646 UTF-8) */
        if(_libssh2_copy_string(session, &decoded,
                                &session->userauth_kybd_prompts[i].text,
                                &session->userauth_kybd_prompts[i].length)
           == -1) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to decode "
                           "keyboard-interactive prompt message");
            return -1;
        }

        /* boolean   echo[1] */
        if(_libssh2_get_boolean(&decoded,
                                &session->userauth_kybd_prompts[i].echo)
           == -1) {
            _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                           "Unable to decode "
                           "user auth keyboard prompt echo");
            return -1;
        }
    }

    return 0;
}